

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  cmMakefile *this_00;
  bool bVar1;
  _Storage<cmSwiftCompileMode,_true> _Var2;
  optional<cmSwiftCompileMode> oVar3;
  string *b;
  cmValue cVar4;
  cmLocalGenerator *pcVar5;
  string swiftCompileModeFlag;
  string compileFlags;
  allocator<char> local_99;
  string local_98;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_78;
  undefined1 local_70 [64];
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._0_8_ = local_70 + 0x10;
  local_70._8_8_ = (cmState *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70[0x10] = '\0';
  this_00 = this->Makefile;
  local_78 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
             __return_storage_ptr__;
  AddLanguageFlags(this,(string *)local_70,target,Compile,lang,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    AppendFeatureOptions(this,(string *)local_70,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)local_70,target,lang,config,arch);
  bVar1 = std::operator==(lang,"Fortran");
  if (bVar1) {
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0x11])(&local_98,this,target,config);
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_70,&local_98);
  }
  else {
    bVar1 = std::operator==(lang,"Swift");
    if (!bVar1) goto LAB_0027d8db;
    oVar3 = GetSwiftCompileMode(this,target,config);
    if (((ulong)oVar3.super__Optional_base<cmSwiftCompileMode,_true,_true>._M_payload.
                super__Optional_payload_base<cmSwiftCompileMode> >> 0x20 & 1) == 0)
    goto LAB_0027d8db;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    _Var2._M_value =
         oVar3.super__Optional_base<cmSwiftCompileMode,_true,_true>._M_payload.
         super__Optional_payload_base<cmSwiftCompileMode>._M_payload;
    if (_Var2._M_value == Wholemodule) {
      std::__cxx11::string::assign((char *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_70 + 0x20),"CMAKE_Swift_COMPILE_OPTIONS_WMO",&local_99);
      cVar4 = cmMakefile::GetDefinition(this_00,(string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_98);
      }
    }
    else if (_Var2._M_value == Incremental) {
      std::__cxx11::string::assign((char *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_70 + 0x20),"CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL",&local_99);
      cVar4 = cmMakefile::GetDefinition(this_00,(string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
      if (cVar4.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&local_98);
      }
    }
    else if (_Var2._M_value == Unknown) {
      b = cmGeneratorTarget::GetName_abi_cxx11_(target);
      cmStrCat<char_const(&)[43],std::__cxx11::string_const&,char_const(&)[2]>
                ((string *)(local_70 + 0x20),
                 (char (*) [43])"Unknown Swift_COMPILATION_MODE on target \'",b,
                 (char (*) [2])0x7731ae);
      IssueMessage(this,AUTHOR_WARNING,(string *)(local_70 + 0x20));
      std::__cxx11::string::~string((string *)(local_70 + 0x20));
    }
    (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_70,&local_98);
  }
  std::__cxx11::string::~string((string *)&local_98);
LAB_0027d8db:
  AddCMP0018Flags(this,(string *)local_70,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)local_70,target,lang);
  AddColorDiagnosticsFlags(this,(string *)local_70,lang);
  std::__cxx11::string::string((string *)&local_98,(string *)&this_00->DefineFlags);
  pcVar5 = (cmLocalGenerator *)local_70;
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,pcVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  GetFrameworkFlags(&local_98,pcVar5,lang,config,target);
  pcVar5 = (cmLocalGenerator *)local_70;
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,pcVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  GetXcFrameworkFlags(&local_98,pcVar5,lang,config,target);
  (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if ((cmState *)local_70._8_8_ != (cmState *)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              (local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_70);
  }
  AddCompileOptions(this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_78,target,lang,config);
  std::__cxx11::string::~string((string *)local_70);
  return (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_78;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  } else if (lang == "Swift") {
    // Only set the compile mode if CMP0157 is set
    if (cm::optional<cmSwiftCompileMode> swiftCompileMode =
          this->GetSwiftCompileMode(target, config)) {
      std::string swiftCompileModeFlag;
      switch (*swiftCompileMode) {
        case cmSwiftCompileMode::Incremental: {
          swiftCompileModeFlag = "-incremental";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_INCREMENTAL")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Wholemodule: {
          swiftCompileModeFlag = "-wmo";
          if (cmValue flag =
                mf->GetDefinition("CMAKE_Swift_COMPILE_OPTIONS_WMO")) {
            swiftCompileModeFlag = *flag;
          }
          break;
        }
        case cmSwiftCompileMode::Singlefile:
          break;
        case cmSwiftCompileMode::Unknown: {
          this->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("Unknown Swift_COMPILATION_MODE on target '",
                     target->GetName(), "'"));
        }
      }
      this->AppendFlags(compileFlags, swiftCompileModeFlag);
    }
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));
  this->AppendFlags(compileFlags,
                    this->GetXcFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}